

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

void xercesc_4_0::XMLString::removeWS(XMLCh *toConvert,MemoryManager *param_2)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  
  if ((toConvert == (XMLCh *)0x0) || (XVar2 = *toConvert, XVar2 == L'\0')) {
    return;
  }
  pXVar1 = toConvert + 1;
  do {
    if ((ushort)XVar2 < 0x21) {
      if ((0x100002600U >> ((ulong)(ushort)XVar2 & 0x3f) & 1) == 0) {
        if ((ulong)(ushort)XVar2 == 0) {
          *toConvert = L'\0';
          return;
        }
        goto LAB_002512ce;
      }
    }
    else {
LAB_002512ce:
      *toConvert = XVar2;
      toConvert = toConvert + 1;
    }
    XVar2 = *pXVar1;
    pXVar1 = pXVar1 + 1;
  } while( true );
}

Assistant:

void XMLString::removeWS(XMLCh* toConvert, MemoryManager* const)
{
    // If no string, then its a failure
    if (( !toConvert ) || ( !*toConvert ))
        return;

    XMLCh* retPtr = toConvert;
    XMLCh* startPtr = toConvert;

    while (*startPtr)
    {
        if ( ( *startPtr != chCR)    &&
             ( *startPtr != chLF)    &&
             ( *startPtr != chHTab)  &&
             ( *startPtr != chSpace)  )
        {
            *retPtr++ = *startPtr;
        }

        startPtr++;
    }

    *retPtr = chNull;
}